

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall QPDFArgParser::completionCommon(QPDFArgParser *this,bool zsh)

{
  char *__s;
  size_type __n;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string path;
  string appdir;
  string progname;
  string local_88;
  string executable;
  string appimage;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&progname,
             *((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->argv,(allocator<char> *)&executable);
  executable._M_dataplus._M_p = (pointer)&executable.field_2;
  executable._M_string_length = 0;
  executable.field_2._M_local_buf[0] = '\0';
  appdir._M_dataplus._M_p = (pointer)&appdir.field_2;
  appdir._M_string_length = 0;
  appimage._M_dataplus._M_p = (pointer)&appimage.field_2;
  appimage._M_string_length = 0;
  appdir.field_2._M_local_buf[0] = '\0';
  appimage.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path,
             (((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->progname_env)._M_dataplus._M_p,(allocator<char> *)&local_88);
  bVar1 = QUtil::get_env(&path,&executable);
  std::__cxx11::string::~string((string *)&path);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&path,"APPDIR",&local_e9);
    bVar1 = QUtil::get_env(&path,&appdir);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&path);
      goto LAB_0014ed62;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"APPIMAGE",&local_ea);
    bVar1 = QUtil::get_env(&local_88,&appimage);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&path);
    __n = appdir._M_string_length;
    if (!bVar1) goto LAB_0014ed62;
    __s = *((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->argv;
    sVar3 = strlen(__s);
    if ((sVar3 <= __n) || (iVar2 = strncmp(appdir._M_dataplus._M_p,__s,__n), iVar2 != 0))
    goto LAB_0014ed62;
  }
  std::__cxx11::string::_M_assign((string *)&progname);
LAB_0014ed62:
  if (zsh) {
    std::operator<<((ostream *)&std::cout,"autoload -U +X bashcompinit && bashcompinit && ");
  }
  std::operator<<((ostream *)&std::cout,"complete -o bashdefault -o default");
  if (!zsh) {
    std::operator<<((ostream *)&std::cout," -o nospace");
  }
  poVar4 = std::operator<<((ostream *)&std::cout," -C \"");
  poVar4 = std::operator<<(poVar4,(string *)&progname);
  poVar4 = std::operator<<(poVar4,"\" ");
  poVar4 = std::operator<<(poVar4,(string *)
                                  &((this->m).
                                    super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->whoami);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::string((string *)&path,(string *)&progname);
  lVar5 = std::__cxx11::string::find((char)&path,0x2f);
  if (lVar5 - 1U < 0xfffffffffffffffe) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"WARNING: ");
    poVar4 = std::operator<<(poVar4,(string *)
                                    &((this->m).
                                      super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->whoami);
    poVar4 = std::operator<<(poVar4," completion enabled");
    poVar4 = std::operator<<(poVar4," using relative path to executable");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&appimage);
  std::__cxx11::string::~string((string *)&appdir);
  std::__cxx11::string::~string((string *)&executable);
  std::__cxx11::string::~string((string *)&progname);
  return;
}

Assistant:

void
QPDFArgParser::completionCommon(bool zsh)
{
    std::string progname = m->argv[0];
    std::string executable;
    std::string appdir;
    std::string appimage;
    if (QUtil::get_env(m->progname_env.c_str(), &executable)) {
        progname = executable;
    } else if (QUtil::get_env("APPDIR", &appdir) && QUtil::get_env("APPIMAGE", &appimage)) {
        // Detect if we're in an AppImage and adjust
        if ((appdir.length() < strlen(m->argv[0])) &&
            (strncmp(appdir.c_str(), m->argv[0], appdir.length()) == 0)) {
            progname = appimage;
        }
    }
    if (zsh) {
        std::cout << "autoload -U +X bashcompinit && bashcompinit && ";
    }
    std::cout << "complete -o bashdefault -o default";
    if (!zsh) {
        std::cout << " -o nospace";
    }
    std::cout << " -C \"" << progname << "\" " << m->whoami << std::endl;
    // Put output before error so calling from zsh works properly
    std::string path = progname;
    size_t slash = path.find('/');
    if ((slash != 0) && (slash != std::string::npos)) {
        std::cerr << "WARNING: " << m->whoami << " completion enabled"
                  << " using relative path to executable" << std::endl;
    }
}